

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void anon_unknown.dwarf_10d873::ReplaceValue
               (VmModule *module,VmValue *value,VmValue *original,VmValue *replacement)

{
  VmBlock *pVVar1;
  VmValue **ppVVar2;
  VariableData *pVVar3;
  uint uVar4;
  VmValue *pVVar5;
  VmValue *pVVar6;
  VmConstant *pVVar7;
  VmConstant *third;
  VmConstant *pVVar8;
  VmConstant *fourth;
  VmInstructionType VVar9;
  VmBlock *pVVar10;
  VmFunction *this;
  ulong uVar11;
  
  if (original == (VmValue *)0x0) {
    __assert_fail("original",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x3f4,
                  "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  if (replacement == (VmValue *)0x0) {
    __assert_fail("replacement",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x3f5,
                  "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  if ((value == (VmValue *)0x0) || (this = (VmFunction *)value, value->typeID != 4)) {
    this = (VmFunction *)0x0;
  }
  if (this == (VmFunction *)0x0) {
    if ((value == (VmValue *)0x0) || (pVVar5 = value, value->typeID != 3)) {
      pVVar5 = (VmValue *)0x0;
    }
    if (pVVar5 == (VmValue *)0x0) {
      if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
        value = (VmValue *)0x0;
      }
      if ((VmInstruction *)value == (VmInstruction *)0x0) {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x488,
                      "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                     );
      }
      if ((((VmInstruction *)value)->cmd != VM_INST_PHI) || (replacement->typeID != 1)) {
        uVar4 = (((VmInstruction *)value)->arguments).count;
        if (uVar4 != 0) {
          uVar11 = 0;
          do {
            if ((((VmInstruction *)value)->arguments).data[uVar11] == original) {
              VmValue::AddUse(replacement,value);
              if ((((VmInstruction *)value)->arguments).count <= uVar11) goto LAB_001a322c;
              (((VmInstruction *)value)->arguments).data[uVar11] = replacement;
              VmValue::RemoveUse(original,value);
            }
            uVar11 = uVar11 + 1;
            uVar4 = (((VmInstruction *)value)->arguments).count;
          } while (uVar11 < uVar4);
        }
        switch(((VmInstruction *)value)->cmd) {
        case VM_INST_LOAD_BYTE:
        case VM_INST_LOAD_SHORT:
        case VM_INST_LOAD_INT:
        case VM_INST_LOAD_FLOAT:
        case VM_INST_LOAD_DOUBLE:
        case VM_INST_LOAD_LONG:
        case VM_INST_LOAD_STRUCT:
        case VM_INST_STORE_BYTE:
        case VM_INST_STORE_SHORT:
        case VM_INST_STORE_INT:
        case VM_INST_STORE_FLOAT:
        case VM_INST_STORE_DOUBLE:
        case VM_INST_STORE_LONG:
        case VM_INST_STORE_STRUCT:
          if (uVar4 == 0) {
LAB_001a322c:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                         );
          }
          ppVVar2 = (((VmInstruction *)value)->arguments).data;
          pVVar5 = *ppVVar2;
          if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 1)) {
            pVVar5 = (VmValue *)0x0;
          }
          if (pVVar5 == (VmValue *)0x0) {
            return;
          }
          if (uVar4 == 1) goto LAB_001a322c;
          pVVar6 = ppVVar2[1];
          if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
            pVVar6 = (VmValue *)0x0;
          }
          pVVar3 = (VariableData *)pVVar5[1].comment.end;
          if (pVVar3 == (VariableData *)0x0) {
            return;
          }
          if (*(int *)&pVVar6[1]._vptr_VmValue == 0) {
            return;
          }
          third = (VmConstant *)0x0;
          pVVar8 = CreateConstantPointer
                             (module->allocator,(SynBase *)0x0,
                              *(int *)&pVVar6[1]._vptr_VmValue + *(int *)&pVVar5[1]._vptr_VmValue,
                              pVVar3,(pVVar5->type).structType,true);
          VVar9 = ((VmInstruction *)value)->cmd;
          pVVar7 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
          if ((((VmInstruction *)value)->arguments).count == 3) {
            third = (VmConstant *)(((VmInstruction *)value)->arguments).data[2];
          }
          fourth = (VmConstant *)0x0;
          pVVar5 = (VmValue *)0x0;
          break;
        default:
          goto switchD_001a2df8_caseD_7;
        case VM_INST_MEM_COPY:
          if (uVar4 == 0) goto LAB_001a322c;
          ppVVar2 = (((VmInstruction *)value)->arguments).data;
          pVVar5 = *ppVVar2;
          if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 1)) {
            pVVar5 = (VmValue *)0x0;
          }
          if (pVVar5 != (VmValue *)0x0) {
            if (uVar4 == 1) goto LAB_001a322c;
            pVVar6 = ppVVar2[1];
            if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
              pVVar6 = (VmValue *)0x0;
            }
            pVVar3 = (VariableData *)pVVar5[1].comment.end;
            if ((pVVar3 != (VariableData *)0x0) && (*(int *)&pVVar6[1]._vptr_VmValue != 0)) {
              pVVar7 = CreateConstantPointer
                                 (module->allocator,(SynBase *)0x0,
                                  *(int *)&pVVar6[1]._vptr_VmValue +
                                  *(int *)&pVVar5[1]._vptr_VmValue,pVVar3,(pVVar5->type).structType,
                                  true);
              VVar9 = ((VmInstruction *)value)->cmd;
              pVVar8 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
              uVar4 = (((VmInstruction *)value)->arguments).count;
              if ((uVar4 < 3) || ((uVar4 == 3 || (uVar4 < 5)))) goto LAB_001a322c;
              ppVVar2 = (((VmInstruction *)value)->arguments).data;
              ChangeInstructionTo(module,(VmInstruction *)value,VVar9,&pVVar7->super_VmValue,
                                  &pVVar8->super_VmValue,ppVVar2[2],ppVVar2[3],ppVVar2[4],
                                  (uint *)0x0);
            }
          }
          uVar4 = (((VmInstruction *)value)->arguments).count;
          if (uVar4 < 3) goto LAB_001a322c;
          ppVVar2 = (((VmInstruction *)value)->arguments).data;
          pVVar5 = ppVVar2[2];
          if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 1)) {
            pVVar5 = (VmValue *)0x0;
          }
          if (pVVar5 == (VmValue *)0x0) {
            return;
          }
          if (uVar4 == 3) goto LAB_001a322c;
          pVVar6 = ppVVar2[3];
          if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
            pVVar6 = (VmValue *)0x0;
          }
          pVVar3 = (VariableData *)pVVar5[1].comment.end;
          if (pVVar3 == (VariableData *)0x0) {
            return;
          }
          if (*(int *)&pVVar6[1]._vptr_VmValue == 0) {
            return;
          }
          third = CreateConstantPointer
                            (module->allocator,(SynBase *)0x0,
                             *(int *)&pVVar6[1]._vptr_VmValue + *(int *)&pVVar5[1]._vptr_VmValue,
                             pVVar3,(pVVar5->type).structType,true);
          uVar4 = (((VmInstruction *)value)->arguments).count;
          if ((uVar4 == 0) || (uVar4 == 1)) goto LAB_001a322c;
          VVar9 = ((VmInstruction *)value)->cmd;
          ppVVar2 = (((VmInstruction *)value)->arguments).data;
          pVVar8 = (VmConstant *)*ppVVar2;
          pVVar7 = (VmConstant *)ppVVar2[1];
          fourth = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
          if ((((VmInstruction *)value)->arguments).count < 5) goto LAB_001a322c;
          pVVar5 = (((VmInstruction *)value)->arguments).data[4];
          break;
        case VM_INST_ADD_LOAD:
        case VM_INST_SUB_LOAD:
        case VM_INST_MUL_LOAD:
        case VM_INST_DIV_LOAD:
        case VM_INST_POW_LOAD:
        case VM_INST_MOD_LOAD:
        case VM_INST_LESS_LOAD:
        case VM_INST_GREATER_LOAD:
        case VM_INST_LESS_EQUAL_LOAD:
        case VM_INST_GREATER_EQUAL_LOAD:
        case VM_INST_EQUAL_LOAD:
        case VM_INST_NOT_EQUAL_LOAD:
        case VM_INST_SHL_LOAD:
        case VM_INST_SHR_LOAD:
        case VM_INST_BIT_AND_LOAD:
        case VM_INST_BIT_OR_LOAD:
        case VM_INST_BIT_XOR_LOAD:
          if (uVar4 < 2) goto LAB_001a322c;
          ppVVar2 = (((VmInstruction *)value)->arguments).data;
          pVVar5 = ppVVar2[1];
          if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 1)) {
            pVVar5 = (VmValue *)0x0;
          }
          if (pVVar5 == (VmValue *)0x0) {
            return;
          }
          if (uVar4 == 2) goto LAB_001a322c;
          pVVar6 = ppVVar2[2];
          if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
            pVVar6 = (VmValue *)0x0;
          }
          pVVar3 = (VariableData *)pVVar5[1].comment.end;
          if (pVVar3 == (VariableData *)0x0) {
            return;
          }
          if (*(int *)&pVVar6[1]._vptr_VmValue == 0) {
            return;
          }
          pVVar7 = CreateConstantPointer
                             (module->allocator,(SynBase *)0x0,
                              *(int *)&pVVar6[1]._vptr_VmValue + *(int *)&pVVar5[1]._vptr_VmValue,
                              pVVar3,(pVVar5->type).structType,true);
          if ((((VmInstruction *)value)->arguments).count == 0) goto LAB_001a322c;
          VVar9 = ((VmInstruction *)value)->cmd;
          pVVar8 = (VmConstant *)*(((VmInstruction *)value)->arguments).data;
          third = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
          if ((((VmInstruction *)value)->arguments).count < 4) goto LAB_001a322c;
          fourth = (VmConstant *)(((VmInstruction *)value)->arguments).data[3];
          pVVar5 = (VmValue *)0x0;
        }
        ChangeInstructionTo(module,(VmInstruction *)value,VVar9,&pVVar8->super_VmValue,
                            &pVVar7->super_VmValue,&third->super_VmValue,&fourth->super_VmValue,
                            pVVar5,(uint *)0x0);
      }
    }
    else {
      for (pVVar5 = (VmValue *)pVVar5[1].comment.end; pVVar5 != (VmValue *)0x0;
          pVVar5 = pVVar5[1].users.little[0]) {
        if (pVVar5 == original) {
          __assert_fail("curr != original",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x418,
                        "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                       );
        }
        ReplaceValue(module,pVVar5,original,replacement);
      }
    }
  }
  else {
    if (this->firstBlock == (VmBlock *)original) {
      VmValue::AddUse(replacement,&this->super_VmValue);
      VmValue::RemoveUse(original,&this->super_VmValue);
    }
    for (pVVar10 = this->firstBlock; pVVar10 != (VmBlock *)0x0; pVVar10 = pVVar10->nextSibling) {
      if ((pVVar10 == (VmBlock *)original) && (pVVar10 != this->firstBlock)) {
        __assert_fail("curr != original || curr == function->firstBlock",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x401,
                      "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                     );
      }
      ReplaceValue(module,&pVVar10->super_VmValue,original,replacement);
    }
    pVVar10 = (VmBlock *)0x0;
    if (replacement->typeID == 3) {
      pVVar10 = (VmBlock *)replacement;
    }
    if (pVVar10 != this->firstBlock) {
      VmFunction::DetachBlock(this,pVVar10);
      pVVar10->parent = this;
      pVVar1 = this->firstBlock;
      pVVar10->nextSibling = pVVar1;
      pVVar1->prevSibling = pVVar10;
      this->firstBlock = pVVar10;
    }
  }
switchD_001a2df8_caseD_7:
  return;
}

Assistant:

void ReplaceValue(VmModule *module, VmValue *value, VmValue *original, VmValue *replacement)
	{
		assert(original);
		assert(replacement);

		if(VmFunction *function = getType<VmFunction>(value))
		{
			if(original == function->firstBlock)
			{
				replacement->AddUse(function);
				original->RemoveUse(function);
			}

			for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			{
				assert(curr != original || curr == function->firstBlock); // Function can only use first block

				ReplaceValue(module, curr, original, replacement);
			}

			// Move replacement block to first position
			VmBlock *block = getType<VmBlock>(replacement);

			if(block != function->firstBlock)
			{
				function->DetachBlock(block);

				block->parent = function;
				block->nextSibling = function->firstBlock;

				function->firstBlock->prevSibling = block;
				function->firstBlock = block;
			}
		}
		else if(VmBlock *block = getType<VmBlock>(value))
		{
			for(VmInstruction *curr = block->firstInstruction; curr; curr = curr->nextSibling)
			{
				assert(curr != original); // Block doesn't use instructions

				ReplaceValue(module, curr, original, replacement);
			}
		}
		else if(VmInstruction *inst = getType<VmInstruction>(value))
		{
			// Can't replace phi instruction argument with a constant
			if(inst->cmd == VM_INST_PHI && isType<VmConstant>(replacement))
				return;

			for(unsigned i = 0; i < inst->arguments.size(); i++)
			{
				if(inst->arguments[i] == original)
				{
					replacement->AddUse(inst);

					inst->arguments[i] = replacement;

					original->RemoveUse(inst);
				}
			}

			// Legalize constant offset in load/store instruction
			switch(inst->cmd)
			{
			case VM_INST_LOAD_BYTE:
			case VM_INST_LOAD_SHORT:
			case VM_INST_LOAD_INT:
			case VM_INST_LOAD_FLOAT:
			case VM_INST_LOAD_DOUBLE:
			case VM_INST_LOAD_LONG:
			case VM_INST_LOAD_STRUCT:
			case VM_INST_STORE_BYTE:
			case VM_INST_STORE_SHORT:
			case VM_INST_STORE_INT:
			case VM_INST_STORE_FLOAT:
			case VM_INST_STORE_DOUBLE:
			case VM_INST_STORE_LONG:
			case VM_INST_STORE_STRUCT:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[0]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments.size() == 3 ? inst->arguments[2] : NULL, NULL, NULL, NULL);
					}
				}
				break;
			case VM_INST_MEM_COPY:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[0]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[2], inst->arguments[3], inst->arguments[4], NULL);
					}
				}

				if(VmConstant *address = getType<VmConstant>(inst->arguments[2]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[3]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, inst->arguments[0], inst->arguments[1], target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[4], NULL);
					}
				}
				break;
			case VM_INST_ADD_LOAD:
			case VM_INST_SUB_LOAD:
			case VM_INST_MUL_LOAD:
			case VM_INST_DIV_LOAD:
			case VM_INST_POW_LOAD:
			case VM_INST_MOD_LOAD:
			case VM_INST_LESS_LOAD:
			case VM_INST_GREATER_LOAD:
			case VM_INST_LESS_EQUAL_LOAD:
			case VM_INST_GREATER_EQUAL_LOAD:
			case VM_INST_EQUAL_LOAD:
			case VM_INST_NOT_EQUAL_LOAD:
			case VM_INST_SHL_LOAD:
			case VM_INST_SHR_LOAD:
			case VM_INST_BIT_AND_LOAD:
			case VM_INST_BIT_OR_LOAD:
			case VM_INST_BIT_XOR_LOAD:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[1]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[2]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, inst->arguments[0], target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[3], NULL, NULL);
					}
				}
				break;
			default:
				break;
			}
		}
		else
		{
			assert(!"unknown type");
		}
	}